

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O0

int __thiscall
booster::locale::impl_icu::calendar_impl::get_value
          (calendar_impl *this,period_mark p,value_type type)

{
  UCalendarDateFields UVar1;
  Calendar *pCVar2;
  undefined4 in_EDX;
  int in_ESI;
  long in_RDI;
  guard l_1;
  UCalendarDateFields uper;
  guard l;
  int v;
  UErrorCode err;
  mutex_type *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  period_mark in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_18;
  undefined4 local_14;
  undefined4 local_10;
  
  local_14 = 0;
  local_18 = 0;
  if (in_ESI == 0x11) {
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78);
    pCVar2 = hold_ptr<icu_70::Calendar>::operator->((hold_ptr<icu_70::Calendar> *)(in_RDI + 0x50));
    local_18 = icu_70::Calendar::getFirstDayOfWeek((UErrorCode *)pCVar2);
    std::unique_lock<std::mutex>::~unique_lock
              ((unique_lock<std::mutex> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  }
  else {
    local_10 = in_EDX;
    UVar1 = to_icu(in_stack_ffffffffffffffc0);
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78);
    switch(local_10) {
    case 0:
      pCVar2 = hold_ptr<icu_70::Calendar>::operator->((hold_ptr<icu_70::Calendar> *)(in_RDI + 0x50))
      ;
      local_18 = (**(code **)(*(long *)pCVar2 + 0x70))(pCVar2,UVar1);
      break;
    case 1:
      pCVar2 = hold_ptr<icu_70::Calendar>::operator->((hold_ptr<icu_70::Calendar> *)(in_RDI + 0x50))
      ;
      local_18 = (**(code **)(*(long *)pCVar2 + 0xa8))(pCVar2,UVar1,&local_14);
      break;
    case 2:
      pCVar2 = hold_ptr<icu_70::Calendar>::operator->((hold_ptr<icu_70::Calendar> *)(in_RDI + 0x50))
      ;
      local_18 = (**(code **)(*(long *)pCVar2 + 0x90))(pCVar2,UVar1);
      break;
    case 3:
      pCVar2 = hold_ptr<icu_70::Calendar>::operator->((hold_ptr<icu_70::Calendar> *)(in_RDI + 0x50))
      ;
      local_18 = icu_70::Calendar::get((UCalendarDateFields)pCVar2,(UErrorCode *)(ulong)UVar1);
      break;
    case 4:
      pCVar2 = hold_ptr<icu_70::Calendar>::operator->((hold_ptr<icu_70::Calendar> *)(in_RDI + 0x50))
      ;
      local_18 = (**(code **)(*(long *)pCVar2 + 0xa0))(pCVar2,UVar1);
      break;
    case 5:
      pCVar2 = hold_ptr<icu_70::Calendar>::operator->((hold_ptr<icu_70::Calendar> *)(in_RDI + 0x50))
      ;
      local_18 = (**(code **)(*(long *)pCVar2 + 0xb0))(pCVar2,UVar1,&local_14);
      break;
    case 6:
      pCVar2 = hold_ptr<icu_70::Calendar>::operator->((hold_ptr<icu_70::Calendar> *)(in_RDI + 0x50))
      ;
      in_stack_ffffffffffffff84 = (**(code **)(*(long *)pCVar2 + 0x80))(pCVar2,UVar1);
      local_18 = in_stack_ffffffffffffff84;
    }
    std::unique_lock<std::mutex>::~unique_lock
              ((unique_lock<std::mutex> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  }
  check_and_throw_dt((UErrorCode *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  return local_18;
}

Assistant:

int get_value(period::marks::period_mark p,value_type type) const
        {
            UErrorCode err=U_ZERO_ERROR;
            int v=0;
            if(p==period::marks::first_day_of_week) {
                guard l(lock_);
                v=calendar_->getFirstDayOfWeek(err);
            }
            else {
                UCalendarDateFields uper=to_icu(p);
                guard l(lock_);
                switch(type) {
                case absolute_minimum:
                    v=calendar_->getMinimum(uper);
                    break;
                case actual_minimum:
                    v=calendar_->getActualMinimum(uper,err);
                    break;
                case greatest_minimum:
                    v=calendar_->getGreatestMinimum(uper);
                    break;
                case current:
                    v=calendar_->get(uper,err);
                    break;
                case least_maximum:
                    v=calendar_->getLeastMaximum(uper);
                    break;
                case actual_maximum:
                    v=calendar_->getActualMaximum(uper,err);
                    break;
                case absolute_maximum:
                    v=calendar_->getMaximum(uper);
                    break;
                }
            }
            check_and_throw_dt(err);
            return v;
        }